

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fir1.cpp
# Opt level: O2

void __thiscall Fir1::Fir1(Fir1 *this,uint number_of_taps,double value)

{
  double *pdVar1;
  double *pdVar2;
  uint i;
  ulong uVar3;
  
  uVar3 = (ulong)number_of_taps * 8;
  pdVar1 = (double *)operator_new__(uVar3);
  this->coefficients = pdVar1;
  pdVar2 = (double *)operator_new__(uVar3);
  this->buffer = pdVar2;
  this->taps = number_of_taps;
  this->offset = 0;
  this->mu = 0.0;
  for (uVar3 = 0; number_of_taps != uVar3; uVar3 = uVar3 + 1) {
    pdVar1[uVar3] = value;
    pdVar2[uVar3] = 0.0;
  }
  return;
}

Assistant:

Fir1::Fir1(unsigned number_of_taps, double value) :
	coefficients(new double[number_of_taps]),
	buffer(new double[number_of_taps]),  
	taps(number_of_taps) {
	for(unsigned int i=0;i<number_of_taps;i++) {
	        coefficients[i] = value;
		buffer[i] = 0;
	}
}